

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O1

tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
__thiscall baryonyx::sparse_matrix<int>::column(sparse_matrix<int> *this,int col)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar3;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> tVar4;
  
  lVar3 = CONCAT44(in_register_00000034,col);
  if (((-1 < (int)in_EDX) && (in_EDX < *(int *)(lVar3 + 0x18) - 1U)) && (*(int *)(lVar3 + 8) != 1))
  {
    lVar2 = *(long *)(lVar3 + 0x30);
    iVar1 = *(int *)(*(long *)(lVar3 + 0x10) + (ulong)in_EDX * 4);
    (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
    .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
         = (_Head_base<0UL,_int_*,_false>)
           (lVar2 + (long)*(int *)(*(long *)(lVar3 + 0x10) + 4 + (ulong)in_EDX * 4) * 8);
    *(long *)&(this->m_rows_access).m_length = lVar2 + (long)iVar1 * 8;
    tVar4.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_4_ =
         in_EDX;
    tVar4.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::col_value_*>.
    super__Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (_Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)
         (_Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)this;
    tVar4.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._4_4_ = 0;
    return (tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
            )tVar4.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    ;
  }
  details::fail_fast("Precondition","m_is_valid_index(0, col)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/sparse-matrix.hpp"
                     ,"200");
}

Assistant:

bool m_is_valid_index(index_type row, index_type col) const noexcept
    {
        return col >= 0 &&
               static_cast<size_type>(col) < (m_cols_access.size() - 1) &&
               row >= 0 &&
               static_cast<size_type>(row) < (m_rows_access.size() - 1);
    }